

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O2

void slang::bitcpy(uint64_t *dest,uint32_t destOffset,uint64_t *src,uint32_t length,
                  uint32_t srcOffset)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong *puVar7;
  ulong *puVar8;
  ulong uVar9;
  
  if (length != 0) {
    puVar7 = dest + (destOffset >> 6);
    uVar6 = srcOffset & 0x3f;
    puVar8 = src + (srcOffset >> 6);
    uVar3 = destOffset & 0x3f;
    if (uVar3 != 0) {
      uVar4 = 0x40 - uVar3;
      if (length <= 0x40 - uVar3) {
        uVar4 = length;
      }
      uVar2 = *puVar8;
      if (uVar6 != 0) {
        uVar2 = uVar2 >> (sbyte)uVar6;
        if (0x40 - uVar6 < uVar4) {
          uVar2 = uVar2 | puVar8[1] << ((byte)(0x40 - uVar6) & 0x3f);
        }
      }
      uVar9 = ~(-1L << ((byte)uVar4 & 0x3f));
      length = length - uVar4;
      *puVar7 = (uVar2 & uVar9) << (sbyte)uVar3 | ~(uVar9 << (sbyte)uVar3) & *puVar7;
      puVar7 = puVar7 + 1;
      puVar8 = puVar8 + (uVar6 + uVar4 >> 6);
      uVar6 = uVar6 + uVar4 & 0x3f;
    }
    lVar5 = 0;
    while( true ) {
      bVar1 = (byte)(0x40 - uVar6);
      if (length >> 6 == (uint)lVar5) break;
      uVar2 = puVar8[lVar5];
      if (uVar6 != 0) {
        uVar2 = uVar2 >> (sbyte)uVar6 | puVar8[lVar5 + 1] << (bVar1 & 0x3f);
      }
      puVar7[lVar5] = uVar2;
      lVar5 = lVar5 + 1;
    }
    uVar3 = length & 0x3f;
    if (uVar3 != 0) {
      uVar9 = -1L << (sbyte)uVar3;
      uVar2 = puVar8[lVar5];
      if ((uVar6 != 0) && (uVar2 = uVar2 >> (sbyte)uVar6, 0x40 - uVar6 < uVar3)) {
        uVar2 = uVar2 | puVar8[lVar5 + 1] << (bVar1 & 0x3f);
      }
      puVar7[lVar5] = uVar9 & puVar7[lVar5] | uVar2 & ~uVar9;
    }
  }
  return;
}

Assistant:

static void bitcpy(uint64_t* dest, uint32_t destOffset, const uint64_t* src, uint32_t length,
                   uint32_t srcOffset = 0) {
    if (length == 0)
        return;

    // Get the first word we want to write to, and the remaining bits are an offset.
    const uint32_t BitsPerWord = SVInt::BITS_PER_WORD;
    dest += destOffset / BitsPerWord;
    destOffset %= BitsPerWord;
    src += srcOffset / BitsPerWord;
    srcOffset %= BitsPerWord;

    // Writing to the first word is a special case, due to the bit offset
    if (destOffset) {
        uint32_t bitsToWrite = std::min(length, BitsPerWord - destOffset);
        length -= bitsToWrite;

        uint64_t srcWord;
        if (srcOffset) {
            // Be careful not to read past the bounds of the array.
            srcWord = *src >> srcOffset;
            if (BitsPerWord - srcOffset < bitsToWrite)
                srcWord |= src[1] << (BitsPerWord - srcOffset);
        }
        else {
            srcWord = *src;
        }

        uint64_t mask = (1ull << bitsToWrite) - 1;
        *dest = (*dest & ~(mask << destOffset)) | ((srcWord & mask) << destOffset);

        dest++;
        srcOffset += bitsToWrite;
        src += srcOffset / BitsPerWord;
        srcOffset %= BitsPerWord;
    }

    // Do a bulk copy of whole words, with all writes to dest word-aligned.
    for (uint32_t i = 0; i < length / BitsPerWord; i++) {
        *dest = srcOffset ? (*src >> srcOffset) | (src[1] << (BitsPerWord - srcOffset)) : *src;
        dest++;
        src++;
    }

    // Handle leftover bits in the final word.
    if (length %= BitsPerWord) {
        uint64_t mask = (1ull << length) - 1;
        uint64_t srcWord;
        if (srcOffset) {
            // Be careful not to read past the bounds of the array.
            srcWord = *src >> srcOffset;
            if (BitsPerWord - srcOffset < length)
                srcWord |= src[1] << (BitsPerWord - srcOffset);
        }
        else {
            srcWord = *src;
        }

        *dest = (*dest & ~mask) | (srcWord & mask);
    }
}